

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall Generator::generateMetacall(Generator *this)

{
  QCommonArrayOps<FunctionDef> *this_00;
  QArrayData *pQVar1;
  FunctionDef *pFVar2;
  IncludePath *pIVar3;
  bool bVar4;
  FILE *__s;
  char *pcVar5;
  size_t __size;
  long in_FS_OFFSET;
  undefined1 local_50 [16];
  ClassDef *pCStack_40;
  Data *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._8_8_ = "QObject";
  bVar4 = operator==((QByteArray *)this->cdef,(char **)(local_50 + 8));
  pcVar5 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"\nint %s::qt_metacall(QMetaObject::Call _c, int _id, void **_a)\n{\n",
          pcVar5);
  if ((!bVar4) && ((this->purestSuperClass).d.size != 0)) {
    pQVar1 = &((this->purestSuperClass).d.d)->super_QArrayData;
    pcVar5 = (this->purestSuperClass).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      fprintf((FILE *)this->out,"    _id = %s::qt_metacall(_c, _id, _a);\n",pcVar5);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      fprintf((FILE *)this->out,"    _id = %s::qt_metacall(_c, _id, _a);\n",pcVar5);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  this_00 = (QCommonArrayOps<FunctionDef> *)(local_50 + 8);
  local_50._8_8_ = (FILE *)0x0;
  pCStack_40 = (ClassDef *)0x0;
  local_38 = (Data *)0x0;
  pFVar2 = (this->cdef->signalList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->signalList).d.size);
  pFVar2 = (this->cdef->slotList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->slotList).d.size);
  pFVar2 = (this->cdef->methodList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->methodList).d.size);
  if ((local_38 != (Data *)0x0) || ((this->cdef->propertyList).d.size != 0)) {
    fwrite("    if (_id < 0)\n        return _id;\n",0x25,1,(FILE *)this->out);
  }
  if (local_38 == (Data *)0x0) goto LAB_0010ca9c;
  fwrite("    if (_c == QMetaObject::InvokeMetaMethod) {\n",0x2f,1,(FILE *)this->out);
  fprintf((FILE *)this->out,"        if (_id < %d)\n",(ulong)local_38 & 0xffffffff);
  fwrite("            qt_static_metacall(this, _c, _id, _a);\n",0x33,1,(FILE *)this->out);
  fprintf((FILE *)this->out,"        _id -= %d;\n    }\n",(ulong)local_38 & 0xffffffff);
  fwrite("    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n",0x3d,1,(FILE *)this->out);
  fprintf((FILE *)this->out,"        if (_id < %d)\n",(ulong)local_38 & 0xffffffff);
  methodsWithAutomaticTypesHelper((Generator *)local_50,(QList<FunctionDef> *)this);
  if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
       *)local_50._0_8_ ==
      (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
       *)0x0) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)local_50);
LAB_0010ca6c:
    __s = (FILE *)this->out;
    pcVar5 = "            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();\n";
    __size = 0x41;
  }
  else {
    pIVar3 = *(IncludePath **)(local_50._0_8_ + 0x30);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)local_50);
    if (pIVar3 == (IncludePath *)0x0) goto LAB_0010ca6c;
    __s = (FILE *)this->out;
    pcVar5 = "            qt_static_metacall(this, _c, _id, _a);\n";
    __size = 0x33;
  }
  fwrite(pcVar5,__size,1,__s);
  fprintf((FILE *)this->out,"        _id -= %d;\n    }\n",(ulong)local_38 & 0xffffffff);
LAB_0010ca9c:
  if ((this->cdef->propertyList).d.size != 0) {
    fprintf((FILE *)this->out,
            "    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty\n            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty\n            || _c == QMetaObject::RegisterPropertyMetaType) {\n        qt_static_metacall(this, _c, _id, _a);\n        _id -= %d;\n    }\n"
           );
  }
  fwrite("    return _id;\n}\n",0x12,1,(FILE *)this->out);
  QArrayDataPointer<FunctionDef>::~QArrayDataPointer
            ((QArrayDataPointer<FunctionDef> *)(local_50 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generateMetacall()
{
    bool isQObject = (cdef->classname == "QObject");

    fprintf(out, "\nint %s::qt_metacall(QMetaObject::Call _c, int _id, void **_a)\n{\n",
             cdef->qualified.constData());

    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    _id = %s::qt_metacall(_c, _id, _a);\n", superClass.constData());
    }


    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    // If there are no methods or properties, we will return _id anyway, so
    // don't emit this comparison -- it is unnecessary, and it makes coverity
    // unhappy.
    if (methodList.size() || cdef->propertyList.size()) {
        fprintf(out, "    if (_id < 0)\n        return _id;\n");
    }

    if (methodList.size()) {
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        if (_id < %d)\n", int(methodList.size()));
        fprintf(out, "            qt_static_metacall(this, _c, _id, _a);\n");
        fprintf(out, "        _id -= %d;\n    }\n", int(methodList.size()));

        fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
        fprintf(out, "        if (_id < %d)\n", int(methodList.size()));

        if (methodsWithAutomaticTypesHelper(methodList).isEmpty())
            fprintf(out, "            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();\n");
        else
            fprintf(out, "            qt_static_metacall(this, _c, _id, _a);\n");
        fprintf(out, "        _id -= %d;\n    }\n", int(methodList.size()));

    }

    if (cdef->propertyList.size()) {
        fprintf(out,
            "    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty\n"
            "            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty\n"
            "            || _c == QMetaObject::RegisterPropertyMetaType) {\n"
            "        qt_static_metacall(this, _c, _id, _a);\n"
            "        _id -= %d;\n    }\n", int(cdef->propertyList.size()));
    }
    fprintf(out,"    return _id;\n}\n");
}